

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

void __thiscall CTcTokenizer::pragma_source_text_group(CTcTokenizer *this)

{
  tc_toktyp_t tVar1;
  tc_toktyp_t tVar2;
  int iVar3;
  size_t sVar4;
  short *psVar5;
  char *__s1;
  byte *in_RDI;
  int f;
  tc_toktyp_t tok;
  int in_stack_0000009c;
  CTcParser *in_stack_000000a0;
  undefined4 in_stack_fffffffffffffff0;
  
  if ((*in_RDI >> 2 & 1) != 0) {
    return;
  }
  tVar1 = next_on_line((CTcTokenizer *)0x29ac9f);
  if (tVar1 == TOKT_EOF) {
    in_stack_fffffffffffffff0 = 1;
  }
  else {
    if ((tVar1 != TOKT_LPAR) || (tVar2 = next_on_line((CTcTokenizer *)0x29acc9), tVar2 != TOKT_SYM))
    {
      log_warning(0x271f);
      goto LAB_0029adae;
    }
    sVar4 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
    if ((sVar4 != 2) ||
       (psVar5 = (short *)CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8)), *psVar5 != 0x6e6f)) {
      sVar4 = CTcToken::get_text_len((CTcToken *)(in_RDI + 0xcc8));
      if (sVar4 == 3) {
        __s1 = CTcToken::get_text((CTcToken *)(in_RDI + 0xcc8));
        iVar3 = memcmp(__s1,"off",3);
        if (iVar3 == 0) {
          in_stack_fffffffffffffff0 = 0;
          goto LAB_0029ad6d;
        }
      }
      log_warning(0x271f);
      goto LAB_0029adae;
    }
    in_stack_fffffffffffffff0 = 1;
LAB_0029ad6d:
    tVar2 = next_on_line((CTcTokenizer *)0x29ad76);
    if (tVar2 != TOKT_RPAR) {
      log_warning(0x271f);
      goto LAB_0029adae;
    }
  }
  CTcParser::set_source_text_group_mode(in_stack_000000a0,in_stack_0000009c);
LAB_0029adae:
  clear_linebuf((CTcTokenizer *)CONCAT44(tVar1,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void CTcTokenizer::pragma_source_text_group()
{
    tc_toktyp_t tok;
    int f;

    /* if we're in preprocess-only mode, just pass the pragma through */
    if (pp_only_mode_)
        return;

    /* get the '(' token and the on/off token, if present */
    if ((tok = next_on_line()) == TOKT_EOF)
    {
        /* no on/off - by default it's on */
        f = TRUE;
    }
    else if (tok == TOKT_LPAR && next_on_line() == TOKT_SYM)
    {
        /* get the on/off mode */
        if (curtok_.get_text_len() == 2
            && memcmp(curtok_.get_text(), "on", 2) == 0)
        {
            /* it's 'on' */
            f = TRUE;
        }
        else if (curtok_.get_text_len() == 3
                 && memcmp(curtok_.get_text(), "off", 3) == 0)
        {
            /* it's 'off' */
            f = FALSE;
        }
        else
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }

        /* make sure we have the ')' token */
        if (next_on_line() != TOKT_RPAR)
        {
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);
            goto done;
        }
    }
    else
    {
        /* anything else is invalid syntax */
        log_warning(TCERR_BAD_PRAGMA_SYNTAX);
        goto done;
    }

    /* set the new mode in the parser */
    G_prs->set_source_text_group_mode(f);

done:
    /* done - discard this line buffer */
    clear_linebuf();
}